

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O2

void opus_ifft_c(kiss_fft_state *st,kiss_fft_cpx *fin,kiss_fft_cpx *fout)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  for (lVar3 = 0; uVar1 = st->nfft, lVar3 < (int)uVar1; lVar3 = lVar3 + 1) {
    fout[st->bitrev[lVar3]] = fin[lVar3];
  }
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    fout[uVar4].i = -fout[uVar4].i;
  }
  opus_fft_impl(st,fout);
  uVar4 = 0;
  uVar2 = (ulong)(uint)st->nfft;
  if (st->nfft < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    fout[uVar4].i = -fout[uVar4].i;
  }
  return;
}

Assistant:

void opus_ifft_c(const kiss_fft_state *st, const kiss_fft_cpx *fin, kiss_fft_cpx *fout) {
    int i;
    celt_assert2 (fin != fout, "In-place FFT not supported");
    /* Bit-reverse the input */
    for (i = 0; i < st->nfft; i++)
        fout[st->bitrev[i]] = fin[i];
    for (i = 0; i < st->nfft; i++)
        fout[i].i = -fout[i].i;
    opus_fft_impl(st, fout);
    for (i = 0; i < st->nfft; i++)
        fout[i].i = -fout[i].i;
}